

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::compressedteximage2d_invalid_size
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if imageSize is not consistent with the format, dimensions, and contents of the specified compressed image data."
             ,&local_41);
  NegativeTestContext::beginSection(ctx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9270,1,1,0,7,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9271,1,1,0,7,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9272,1,1,0,0xf,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9273,1,1,0,0xf,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9274,1,1,0,7,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9275,1,1,0,7,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9276,1,1,0,7,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9277,1,1,0,7,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9278,1,1,0,0xf,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9279,1,1,0,0xf,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b0,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b1,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b2,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b3,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b4,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b5,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b6,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b7,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b8,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93b9,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93ba,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93bb,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93bc,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93bd,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d0,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d1,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d2,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d3,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d4,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d5,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d6,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d7,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d8,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93d9,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93da,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93db,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93dc,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,0xde1,0,0x93dd,1,1,0,0xf,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void compressedteximage2d_invalid_size (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if imageSize is not consistent with the format, dimensions, and contents of the specified compressed image data.");
	// Subtracting 1 to the imageSize field to deviate from the expected size. Removing the -1 would cause the imageSize to be correct.
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_R11_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SIGNED_R11_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RG11_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SIGNED_RG11_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGB8_ETC2, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ETC2, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_4x4, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_5x4, 1, 1, 0, divRoundUp(1, 5) * divRoundUp(1, 4) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_5x5, 1, 1, 0, divRoundUp(1, 5) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_6x5, 1, 1, 0, divRoundUp(1, 6) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_6x6, 1, 1, 0, divRoundUp(1, 6) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_8x5, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_8x6, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_8x8, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 8) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_10x5, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_10x6, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_10x8, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 8) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_10x10, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 10) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_12x10, 1, 1, 0, divRoundUp(1, 12) * divRoundUp(1, 10) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_12x12, 1, 1, 0, divRoundUp(1, 12) * divRoundUp(1, 12) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4, 1, 1, 0, divRoundUp(1, 5) * divRoundUp(1, 4) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5, 1, 1, 0, divRoundUp(1, 5) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5, 1, 1, 0, divRoundUp(1, 6) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6, 1, 1, 0, divRoundUp(1, 6) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 8) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 8) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 10) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10, 1, 1, 0, divRoundUp(1, 12) * divRoundUp(1, 10) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12, 1, 1, 0, divRoundUp(1, 12) * divRoundUp(1, 12) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	}
	ctx.endSection();
}